

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O1

int trans_cmp_fn(ScanStateTransition *a,ScanStateTransition *b,hash_fns_t *fns)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  if (((fns->data[0] != (void *)0x0) || ((a->live_diff).n == (b->live_diff).n)) &&
     (uVar1 = (a->accepts_diff).n, uVar1 == (b->accepts_diff).n)) {
    if ((fns->data[0] == (void *)0x0) && (uVar2 = (a->live_diff).n, uVar2 != 0)) {
      lVar3 = 0;
      do {
        if ((a->live_diff).v[lVar3] != (b->live_diff).v[lVar3]) {
          return 1;
        }
        lVar3 = lVar3 + 1;
      } while (uVar2 != (uint)lVar3);
    }
    if (uVar1 != 0) {
      lVar3 = 0;
      do {
        if ((a->accepts_diff).v[lVar3] != (b->accepts_diff).v[lVar3]) {
          return 1;
        }
        lVar3 = lVar3 + 1;
      } while (uVar1 != (uint)lVar3);
    }
    return 0;
  }
  return 1;
}

Assistant:

static int trans_cmp_fn(ScanStateTransition *a, ScanStateTransition *b, hash_fns_t *fns) {
  uint i;

  if (!fns->data[0])
    if (a->live_diff.n != b->live_diff.n) return 1;
  if (a->accepts_diff.n != b->accepts_diff.n) return 1;
  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++)
      if (a->live_diff.v[i] != b->live_diff.v[i]) return 1;
  for (i = 0; i < a->accepts_diff.n; i++)
    if (a->accepts_diff.v[i] != b->accepts_diff.v[i]) return 1;
  return 0;
}